

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hashes.cpp
# Opt level: O1

uint32_t FNV32a_YoshimitsuTRIAD(char *key,int len,uint32_t seed)

{
  uint uVar1;
  uint *puVar2;
  uint uVar3;
  uint8_t *p;
  uint uVar4;
  
  uVar4 = 0x811c9dc5;
  uVar3 = seed ^ 0x811c9dc5;
  uVar1 = len + 0x811c9dc5;
  puVar2 = (uint *)key;
  if (0x17 < (uint)len) {
    uVar4 = 0x811c9dc5;
    do {
      uVar3 = (uVar3 ^ puVar2[1] ^ (*puVar2 >> 0x1b | *puVar2 << 5)) * 0xad3e7;
      uVar1 = (uVar1 ^ puVar2[3] ^ (puVar2[2] >> 0x1b | puVar2[2] << 5)) * 0xad3e7;
      uVar4 = (uVar4 ^ puVar2[5] ^ (puVar2[4] >> 0x1b | puVar2[4] << 5)) * 0xad3e7;
      len = len - 0x18;
      puVar2 = puVar2 + 6;
    } while (0x17 < (uint)len);
  }
  uVar4 = ((uVar4 >> 0x1b | uVar4 << 5) ^ uVar3) * 0xad3e7;
  if (puVar2 == (uint *)key) {
    uVar4 = uVar3;
  }
  if (0xf < (uint)len) {
    uVar4 = ((*puVar2 >> 0x1b | *puVar2 << 5) ^ puVar2[1] ^ uVar4) * 0xad3e7;
    uVar1 = ((puVar2[2] >> 0x1b | puVar2[2] << 5) ^ puVar2[3] ^ uVar1) * 0xad3e7;
    puVar2 = puVar2 + 4;
  }
  if ((len & 8U) != 0) {
    uVar4 = (uVar4 ^ *puVar2) * 0xad3e7;
    uVar1 = (uVar1 ^ puVar2[1]) * 0xad3e7;
    puVar2 = puVar2 + 2;
  }
  if ((len & 4U) != 0) {
    uVar4 = (uVar4 ^ (ushort)*puVar2) * 0xad3e7;
    uVar1 = (uVar1 ^ *(ushort *)((long)puVar2 + 2)) * 0xad3e7;
    puVar2 = puVar2 + 1;
  }
  if ((len & 2U) != 0) {
    uVar4 = (uVar4 ^ (ushort)*puVar2) * 0xad3e7;
    puVar2 = (uint *)((long)puVar2 + 2);
  }
  if ((len & 1U) != 0) {
    uVar4 = (uVar4 ^ (byte)*puVar2) * 0xad3e7;
  }
  uVar1 = ((uVar1 >> 0x1b | uVar1 << 5) ^ uVar4) * 0xad3e7;
  return uVar1 >> 0x10 ^ uVar1;
}

Assistant:

uint32_t
FNV32a_YoshimitsuTRIAD(const char *key, int len, uint32_t seed)
{
  const uint8_t  *p = (const uint8_t *)key;
  const uint32_t  PRIME = 709607;
  uint32_t	  hash32A = seed ^ UINT32_C(2166136261);
  uint32_t	  hash32B = UINT32_C(2166136261) + len;
  uint32_t	  hash32C = UINT32_C(2166136261);

  for (; len >= 3 * 2 * sizeof(uint32_t); len -= 3 * 2 * sizeof(uint32_t), p += 3 * 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5)  ^ *(uint32_t *) (p + 4)))  * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5)  ^ *(uint32_t *) (p + 12))) * PRIME;
    hash32C = (hash32C ^ (ROTL32(*(uint32_t *) (p + 16), 5) ^ *(uint32_t *) (p + 20))) * PRIME;
  }
  if (p != (const uint8_t *)key) {
    hash32A = (hash32A ^ ROTL32(hash32C, 5)) * PRIME;
  }
  //Cases 0. .31
  if (len & 4 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ (ROTL32(*(uint32_t *) (p + 0), 5) ^ *(uint32_t *) (p + 4))) * PRIME;
    hash32B = (hash32B ^ (ROTL32(*(uint32_t *) (p + 8), 5) ^ *(uint32_t *) (p + 12))) * PRIME;
    p += 8 * sizeof(uint16_t);
  }
  //Cases 0. .15
  if (len & 2 * sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint32_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint32_t *) (p + 4)) * PRIME;
    p += 4 * sizeof(uint16_t);
  }
  //Cases:0. .7
  if (len & sizeof(uint32_t)) {
    hash32A = (hash32A ^ *(uint16_t *) (p + 0)) * PRIME;
    hash32B = (hash32B ^ *(uint16_t *) (p + 2)) * PRIME;
    p += 2 * sizeof(uint16_t);
  }
  //Cases:0. .3
  if (len & sizeof(uint16_t)) {
    hash32A = (hash32A ^ *(uint16_t *) p) * PRIME;
    p += sizeof(uint16_t);
  }
  if (len & 1)
    hash32A = (hash32A ^ *p) * PRIME;

  hash32A = (hash32A ^ ROTL32(hash32B, 5)) * PRIME;
  return hash32A ^ (hash32A >> 16);
}